

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

void __thiscall
duckdb::CachingPhysicalOperator::CachingPhysicalOperator
          (CachingPhysicalOperator *this,PhysicalOperatorType type,
          vector<duckdb::LogicalType,_true> *types_p,idx_t estimated_cardinality)

{
  bool bVar1;
  PhysicalOperatorType type_01;
  iterator this_00;
  iterator type_00;
  idx_t in_RDX;
  vector<duckdb::LogicalType,_true> *in_RDI;
  LogicalType *col_type;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  PhysicalOperator *this_01;
  
  type_01 = INVALID;
  this_01 = (PhysicalOperator *)&stack0xffffffffffffffc8;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff68);
  PhysicalOperator::PhysicalOperator(this_01,type_01,in_RDI,in_RDX);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7a04bb);
  (in_RDI->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__CachingPhysicalOperator_03509320;
  *(undefined1 *)
   &in_RDI[5].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  this_00 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                      (in_stack_ffffffffffffff68);
  type_00 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                      (in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator*((__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                 *)&stack0xffffffffffffffa8);
    in_stack_ffffffffffffff77 =
         CanCacheType((CachingPhysicalOperator *)this_00._M_current,type_00._M_current);
    if (!(bool)in_stack_ffffffffffffff77) break;
    __gnu_cxx::
    __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++((__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  *(undefined1 *)
   &in_RDI[5].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  return;
}

Assistant:

CachingPhysicalOperator::CachingPhysicalOperator(PhysicalOperatorType type, vector<LogicalType> types_p,
                                                 idx_t estimated_cardinality)
    : PhysicalOperator(type, std::move(types_p), estimated_cardinality) {

	caching_supported = true;
	for (auto &col_type : types) {
		if (!CanCacheType(col_type)) {
			caching_supported = false;
			break;
		}
	}
}